

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

ssize_t value_size(value_t *value)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = value->type;
  if (iVar1 < 0x62) {
    if (((iVar1 == 0x43) || (iVar1 == 0x53)) || (iVar1 == 0x55)) {
switchD_0010a183_caseD_66:
      return 4;
    }
  }
  else if (iVar1 < 0x73) {
    switch(iVar1) {
    case 0x62:
    case 99:
      return 1;
    case 100:
      return 8;
    case 0x66:
      goto switchD_0010a183_caseD_66;
    case 0x6d:
      return (ssize_t)(value->val).d;
    }
  }
  else {
    if ((iVar1 == 0x73) || (iVar1 == 0x75)) {
      return 2;
    }
    if (iVar1 == 0x7a) {
      sVar2 = strlen((value->val).z);
      return sVar2;
    }
  }
  value_size_cold_1();
  return -1;
}

Assistant:

ssize_t
value_size(
    const value_t* value)
{
    switch (value->type) {
    case 'f':
        return sizeof(float);
    case 'd':
        return sizeof(double);
    case 'b':
        return sizeof(unsigned char);
    case 'c':
        return sizeof(char);
    case 'u':
        return sizeof(uint16_t);
    case 's':
        return sizeof(int16_t);
    case 'U':
        return sizeof(uint32_t);
    case 'S':
        return sizeof(int32_t);
    case 'C':
        return sizeof(uint32_t);
    case 'z':
        return strlen(value->val.z);
    case 'm':
        return value->val.m.length;
    default:
        fprintf(stderr, "%s:value_size: invalid type '%c'\n", argv0, value->type);
        return -1;
    }
}